

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageNextXrDestroyInstance(XrInstance instance)

{
  XrResult XVar1;
  GenValidUsageXrInstanceInfo *instance_info;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  XrResult result;
  XrInstance instance_local;
  
  instance_info =
       HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>::get
                 (&g_instance_info.super_HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>
                  ,instance);
  XVar1 = (*instance_info->dispatch_table->DestroyInstance)(instance);
  if (XR_ERROR_VALIDATION_FAILURE < XVar1) {
    HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>::erase
              (&g_instance_info.super_HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>,
               instance);
  }
  GenValidUsageCleanUpMaps(instance_info);
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrDestroyInstance(
    XrInstance instance) {
    XrResult result = XR_SUCCESS;
    try {
        GenValidUsageXrInstanceInfo *gen_instance_info = g_instance_info.get(instance);
        result = gen_instance_info->dispatch_table->DestroyInstance(instance);
        if (XR_SUCCEEDED(result)) {
            g_instance_info.erase(instance);
        }
        GenValidUsageCleanUpMaps(gen_instance_info);
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}